

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O2

void __thiscall Chromosome::inverse(Chromosome *this,size_t ip1,size_t ip2)

{
  ulong uVar1;
  pointer pbVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  reference local_78;
  size_t local_68;
  ulong local_60;
  Chromosome *local_58;
  long local_50;
  reference local_48;
  pointer local_38;
  
  local_38 = (this->genes).
             super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_50 = ~ip1 + ip2;
  local_68 = ip2;
  local_60 = ip1;
  local_58 = this;
  while( true ) {
    uVar3 = local_60;
    lVar5 = local_50;
    if (local_38 ==
        (local_58->genes).super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    for (; pbVar2 = local_38, uVar3 < local_68; uVar3 = uVar3 + 1) {
      local_78._M_bpos = (size_t)((uint)uVar3 & 0x3f);
      uVar1 = (local_38->super__Base_bitset<1UL>)._M_w >> local_78._M_bpos;
      local_48._M_wp = (_WordT *)local_38;
      uVar4 = (ulong)((uint)lVar5 & 0x3f);
      local_78._M_wp = (_WordT *)local_38;
      local_48._M_bpos = uVar4;
      std::bitset<50UL>::reference::operator=(&local_78,&local_48);
      local_48._M_wp = (_WordT *)pbVar2;
      local_48._M_bpos = uVar4;
      std::bitset<50UL>::reference::operator=(&local_48,(uVar1 & 1) != 0);
      lVar5 = lVar5 + -1;
    }
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void Chromosome::inverse( size_t ip1, size_t ip2 )
{
	for(genes_t::iterator it = genes.begin(); it != genes.end(); ++it)
	{
		for(size_t i = ip1; i < ip2; ++i)
		{
			size_t ctr = i - ip1;

			bool tmp = (*it)[i];
			(*it)[i] = (*it)[ (ip2-1) - i];
			(*it)[ (ip2-1) - i] = tmp;
		}
	}
}